

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int writer(UI *ui,UI_STRING *uis)

{
  int *in_RCX;
  size_t in_RDX;
  str_Writer *state;
  void *ud_local;
  size_t size_local;
  void *b_local;
  lua_State *L_local;
  
  if (*in_RCX == 0) {
    *in_RCX = 1;
    luaL_buffinit((lua_State *)ui,(luaL_Buffer *)(in_RCX + 2));
  }
  luaL_addlstring((luaL_Buffer *)(in_RCX + 2),(char *)uis,in_RDX);
  return 0;
}

Assistant:

static int writer (lua_State *L, const void *b, size_t size, void *ud) {
  struct str_Writer *state = (struct str_Writer *)ud;
  if (!state->init) {
    state->init = 1;
    luaL_buffinit(L, &state->B);
  }
  luaL_addlstring(&state->B, (const char *)b, size);
  return 0;
}